

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_buffer.h
# Opt level: O1

void __thiscall
PenguinV_Image::ImageTemplate<unsigned_char>::fill(ImageTemplate<unsigned_char> *this,uchar value)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  FunctionFacade *this_00;
  _func_void_uchar_ptr_uchar_unsigned_long *UNRECOVERED_JUMPTABLE;
  
  puVar3 = this->_data;
  if (puVar3 != (uchar *)0x0) {
    uVar1 = this->_height;
    uVar2 = this->_rowSize;
    this_00 = FunctionFacade::instance();
    UNRECOVERED_JUMPTABLE =
         __PenguinV_Image__ImageTemplate<unsigned_char>__FunctionFacade___getFunction<void(*)(unsigned_char*,unsigned_char,unsigned_long)>_std__vector<void(*)(unsigned_char*,unsigned_char,unsigned_long),std::allocator<void(*)(unsigned_char*,unsigned_char,unsigned_long)>>const__unsigned_char_const_
                   (this_00,&this_00->_set,this->_type);
    (*UNRECOVERED_JUMPTABLE)(puVar3,value,(ulong)uVar2 * (ulong)uVar1);
    return;
  }
  return;
}

Assistant:

bool empty() const
        {
            return _data == nullptr;
        }